

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

lws_context * lws_create_context(lws_context_creation_info *info)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  byte bVar4;
  lws_retry_bo_t *plVar5;
  bool bVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  lws_context *context;
  lws_usec_t lVar10;
  long lVar11;
  lws_role_ops *plVar12;
  pollfd *ppVar13;
  size_t sVar14;
  lws_event_loop_ops *plVar15;
  lws_vhost *plVar16;
  char *pcVar17;
  lws_context_tls *plVar18;
  long lVar19;
  lws **pplVar20;
  uint uVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  lws_role_ops **pplVar25;
  lws_context *plVar26;
  lws_context_tls *str;
  lws_event_loop_ops **pplVar27;
  
  uVar21 = info->fd_limit_per_thread + 2;
  if (info->fd_limit_per_thread == 0) {
    uVar21 = 0;
  }
  uVar22 = (ulong)uVar21;
  _lws_log(8,"Initial logging level %d\n",(ulong)(uint)log_level);
  _lws_log(8,"Libwebsockets version: %s\n","3.2.99 unknown-build-hash");
  _lws_log(8,"IPV6 not compiled in\n");
  _lws_log(8," LWS_DEF_HEADER_LEN    : %u\n",0x1000);
  _lws_log(8," LWS_MAX_SMP           : %u\n",1);
  _lws_log(8," sizeof (*info)        : %ld\n",0x2e0);
  _lws_log(8," SYSTEM_RANDOM_FILEPATH: \'%s\'\n","/dev/urandom");
  _lws_log(8," HTTP2 support         : available\n");
  iVar8 = lws_plat_context_early_init();
  if (iVar8 != 0) {
    return (lws_context *)0x0;
  }
  iVar9 = info->count_threads + (uint)(info->count_threads == 0);
  iVar8 = 1;
  if (iVar9 < 1) {
    iVar8 = iVar9;
  }
  uVar24 = 0x1000;
  if (info->pt_serv_buf_size != 0) {
    uVar24 = (ulong)info->pt_serv_buf_size;
  }
  context = (lws_context *)lws_zalloc((uVar24 + 0x300) * (long)iVar8 + 0x528,"context");
  if (context == (lws_context *)0x0) {
    pcVar17 = "No memory for websocket context\n";
LAB_0010db3c:
    _lws_log(1,pcVar17);
    return (lws_context *)0x0;
  }
  uVar1 = info->gid;
  uVar2 = info->uid;
  context->uid = uVar2;
  context->gid = uVar1;
  pcVar17 = info->groupname;
  context->username = info->username;
  context->groupname = pcVar17;
  context->system_ops = info->system_ops;
  context->pt_serv_buf_size = (uint)uVar24;
  bVar3 = info->udp_loss_sim_tx_pc;
  context->udp_loss_sim_tx_pc = bVar3;
  bVar4 = info->udp_loss_sim_rx_pc;
  context->udp_loss_sim_rx_pc = bVar4;
  if (bVar3 != 0 || bVar4 != 0) {
    _lws_log(2,"%s: simulating udp loss tx: %d%%, rx: %d%%\n","lws_create_context",(ulong)bVar3,
             (ulong)bVar4);
  }
  context->count_threads = (short)iVar8;
  if (info->extensions != (lws_extension *)0x0) {
    _lws_log(2,"%s: LWS_WITHOUT_EXTENSIONS but extensions ptr set\n","lws_create_context");
  }
  iVar8 = lws_plat_drop_app_privileges(context,0);
  if (iVar8 != 0) goto LAB_0010db28;
  _lws_log(8,"context created\n");
  context->tls_ops = &tls_ops_openssl;
  (context->fops_platform).open = _lws_plat_file_open;
  (context->fops_platform).close = _lws_plat_file_close;
  (context->fops_platform).seek_cur = _lws_plat_file_seek_cur;
  (context->fops_platform).read = _lws_plat_file_read;
  (context->fops_platform).write = _lws_plat_file_write;
  (context->fops_platform).fi[0].sig = (char *)0x0;
  context->fops = &context->fops_platform;
  if (info->fops != (lws_plat_file_ops *)0x0) {
    (context->fops_platform).next = info->fops;
  }
  context->reject_service_keywords = info->reject_service_keywords;
  if (info->external_baggage_free_on_destroy != (void *)0x0) {
    context->external_baggage_free_on_destroy = info->external_baggage_free_on_destroy;
  }
  lVar10 = lws_now_usecs();
  context->time_up = lVar10;
  context->pcontext_finalize = info->pcontext;
  context->simultaneous_ssl_restriction = info->simultaneous_ssl_restriction;
  context->options = info->options;
  lVar11 = sysconf(4);
  iVar8 = (int)lVar11;
  context->max_fds = iVar8;
  if (iVar8 < 0) {
    _lws_log(1,"%s: problem getting process max files\n","lws_create_context");
    return (lws_context *)0x0;
  }
  if ((info->fd_limit_per_thread != 0) &&
     (iVar9 = (int)context->count_threads * uVar21, iVar9 < iVar8)) {
    context->field_0x511 = context->field_0x511 | 4;
    context->max_fds = iVar9;
  }
  context->token_limits = info->token_limits;
  context->event_loop_ops = &event_loop_ops_poll;
  if ((context->options & 0x200200410) == 0) {
    _lws_log(8,"Using event loop: %s\n",event_loop_ops_poll.name);
    time(&(context->tls).last_cert_check_s);
    plVar18 = (lws_context_tls *)info->alpn;
    if ((plVar18 == (lws_context_tls *)0x0) &&
       (plVar18 = &context->tls, available_roles[0] != (lws_role_ops *)0x0)) {
      pplVar25 = available_roles;
      bVar6 = true;
      plVar12 = available_roles[0];
      str = plVar18;
      do {
        pplVar25 = pplVar25 + 1;
        pcVar17 = plVar12->alpn;
        if (pcVar17 != (char *)0x0) {
          if (!bVar6) {
            str->alpn_discovered[0] = ',';
            str = (lws_context_tls *)(str->alpn_discovered + 1);
            pcVar17 = plVar12->alpn;
          }
          bVar6 = false;
          iVar8 = lws_snprintf(str->alpn_discovered,(long)context + (0x38e - (long)str),"%s",pcVar17
                              );
          str = (lws_context_tls *)(str->alpn_discovered + iVar8);
        }
        plVar12 = *pplVar25;
      } while (plVar12 != (lws_role_ops *)0x0);
    }
    (context->tls).alpn_default = plVar18->alpn_discovered;
    _lws_log(8,"Default ALPN advertisment: %s\n");
    uVar21 = 0x14;
    if (info->timeout_secs != 0) {
      uVar21 = info->timeout_secs;
    }
    context->timeout_secs = uVar21;
    context->ws_ping_pong_interval = info->ws_ping_pong_interval;
    _lws_log(8," default timeout (secs): %u\n");
    uVar21 = (uint)info->max_http_header_data;
    if ((info->max_http_header_data == 0) && (uVar21 = info->max_http_header_data2, uVar21 == 0)) {
      context->max_http_header_data = 0x1000;
    }
    else {
      context->max_http_header_data = uVar21;
    }
    uVar21 = (uint)info->max_http_header_pool;
    if ((info->max_http_header_pool == 0) && (uVar21 = info->max_http_header_pool2, uVar21 == 0)) {
      uVar21 = context->max_fds;
    }
    context->max_http_header_pool = uVar21;
    if (info->fd_limit_per_thread == 0) {
      uVar22 = (long)context->max_fds / (long)(int)context->count_threads & 0xffffffff;
    }
    context->fd_limit_per_thread = (uint)uVar22;
    (context->default_retry).retry_ms_table = default_backoff_table;
    (context->default_retry).retry_ms_table_count = 4;
    (context->default_retry).conceal_count = 4;
    (context->default_retry).secs_since_valid_ping = 300;
    (context->default_retry).secs_since_valid_hangup = 0x136;
    (context->default_retry).jitter_percent = '\x14';
    plVar5 = info->retry_and_idle_policy;
    if ((plVar5 != (lws_retry_bo_t *)0x0) && (plVar5->secs_since_valid_ping != 0)) {
      (context->default_retry).secs_since_valid_ping = plVar5->secs_since_valid_ping;
      (context->default_retry).secs_since_valid_hangup = plVar5->secs_since_valid_hangup;
    }
    sVar7 = context->count_threads;
    if (0 < sVar7) {
      plVar26 = context + 1;
      lVar11 = 0;
      do {
        lVar19 = lVar11 * 0x188;
        context->pt[lVar11].serv_buf = (uchar *)plVar26;
        uVar21 = context->pt_serv_buf_size;
        context->pt[lVar11].context = context;
        *(char *)((long)&context->set + lVar19 + -0x42) = (char)lVar11;
        context->pt[lVar11].fake_wsi = (lws *)(plVar26->canonical_hostname + uVar21);
        memset((lws *)(plVar26->canonical_hostname + uVar21),0,0x300);
        *(undefined8 *)((long)&context->set + lVar19 + -0x78) = 0;
        *(undefined4 *)((long)&context->set + lVar19 + -100) = 0;
        lws_seq_pt_init(context->pt + lVar11);
        plVar12 = available_roles[0];
        pplVar25 = available_roles;
        while (pplVar25 = pplVar25 + 1, plVar12 != (lws_role_ops *)0x0) {
          if (plVar12->pt_init_destroy !=
              (_func_int_lws_context_ptr_lws_context_creation_info_ptr_lws_context_per_thread_ptr_int
               *)0x0) {
            (*plVar12->pt_init_destroy)(context,info,context->pt + lVar11,0);
          }
          plVar12 = *pplVar25;
        }
        plVar26 = (lws_context *)((long)(&plVar26->set + -2) + (ulong)uVar21);
        lVar11 = lVar11 + 1;
        sVar7 = context->count_threads;
      } while (lVar11 < sVar7);
      uVar22 = (ulong)context->fd_limit_per_thread;
    }
    _lws_log(8," Threads: %d each %d fds\n",(ulong)(uint)(int)sVar7,uVar22);
    if ((info->ka_interval == 0) && (0 < info->ka_time)) {
      pcVar17 = "info->ka_interval can\'t be 0 if ka_time used\n";
      goto LAB_0010db3c;
    }
    _lws_log(8," mem: context:         %5lu B (%ld ctx + (%ld thr x %d))\n",
             (ulong)(context->pt_serv_buf_size * (int)context->count_threads) + 0x528,0x528);
    _lws_log(8," mem: http hdr size:   (%u + %lu), max count %u\n",
             (ulong)(uint)context->max_http_header_data,0x3d0,
             (ulong)(uint)context->max_http_header_pool);
    uVar21 = (int)context->count_threads * context->fd_limit_per_thread * 8;
    ppVar13 = (pollfd *)lws_zalloc((long)(int)uVar21,"fds table");
    context->pt[0].fds = ppVar13;
    if (ppVar13 == (pollfd *)0x0) {
      _lws_log(1,"OOM allocating %d fds\n",(ulong)(uint)context->max_fds);
    }
    else {
      _lws_log(8," mem: pollfd map:      %5u B\n",(ulong)uVar21);
      pcVar17 = info->server_string;
      if (pcVar17 != (char *)0x0) {
        context->server_string = pcVar17;
        sVar14 = strlen(pcVar17);
        context->server_string_len = (short)sVar14;
      }
      iVar8 = lws_plat_init(context,info);
      if (iVar8 == 0) {
        plVar15 = context->event_loop_ops;
        if (plVar15->init_context != (_func_int_lws_context_ptr_lws_context_creation_info_ptr *)0x0)
        {
          iVar8 = (*plVar15->init_context)(context,info);
          if (iVar8 != 0) goto LAB_0010db28;
          plVar15 = context->event_loop_ops;
        }
        if ((plVar15->init_pt != (_func_int_lws_context_ptr_void_ptr_int *)0x0) &&
           (0 < context->count_threads)) {
          lVar11 = 0;
          do {
            if (info->foreign_loops == (void **)0x0) {
              pvVar23 = (void *)0x0;
            }
            else {
              pvVar23 = info->foreign_loops[lVar11];
            }
            iVar8 = (*context->event_loop_ops->init_pt)(context,pvVar23,(int)lVar11);
            if (iVar8 != 0) goto LAB_0010db28;
            lVar11 = lVar11 + 1;
          } while (lVar11 < context->count_threads);
        }
        iVar8 = lws_create_event_pipes(context);
        if (iVar8 == 0) {
          lws_context_init_ssl_library(info);
          context->user_space = info->user;
          builtin_strncpy(context->canonical_hostname,"unknown",8);
          lws_server_get_canonical_hostname(context,info);
          (context->mgr_system).state_names = system_state_names;
          (context->mgr_system).name = "system";
          (context->mgr_system).state = 1;
          (context->mgr_system).parent = context;
          (context->protocols_notify).name = "prot_init";
          (context->protocols_notify).notify_cb = lws_state_notify_protocol_init;
          lws_state_reg_notifier(&context->mgr_system,&context->protocols_notify);
          lws_state_reg_notifier_list(&context->mgr_system,info->register_notifier_list);
          if (((info->options & 0x2000) == 0) &&
             (plVar16 = lws_create_vhost(context,info), plVar16 == (lws_vhost *)0x0)) {
            _lws_log(1,"Failed to create default vhost\n");
            if (0 < context->count_threads) {
              pplVar20 = &context->pt[0].pipe_wsi;
              lVar11 = 0;
              do {
                lws_destroy_event_pipe(*pplVar20);
                lVar11 = lVar11 + 1;
                pplVar20 = pplVar20 + 0x31;
              } while (lVar11 < context->count_threads);
            }
            pcVar17 = "free";
            lws_realloc(context->pt[0].fds,0,"free");
            context->pt[0].fds = (pollfd *)0x0;
            lws_plat_context_late_destroy(context);
            goto LAB_0010dd00;
          }
          _lws_log(8," mem: per-conn:        %5lu bytes + protocol rx buf\n",0x300);
          if (((info->options & 0x2000) != 0) ||
             (iVar8 = lws_plat_drop_app_privileges(context,1), iVar8 == 0)) {
            lws_sul_schedule(context,0,&context->sul_system_state,lws_context_creation_completion_cb
                             ,1);
            lws_cancel_service(context);
            return context;
          }
        }
      }
    }
LAB_0010db28:
    lws_context_destroy(context);
  }
  else {
    _lws_log(1,"Requested event library support not configured, available:\n");
    if (available_event_libs[0] != (lws_event_loop_ops *)0x0) {
      pplVar27 = available_event_libs;
      plVar15 = available_event_libs[0];
      do {
        pplVar27 = pplVar27 + 1;
        _lws_log(1,"  - %s\n",plVar15->name);
        plVar15 = *pplVar27;
      } while (plVar15 != (lws_event_loop_ops *)0x0);
    }
    pcVar17 = "lws_free";
LAB_0010dd00:
    lws_realloc(context,0,pcVar17);
  }
  return (lws_context *)0x0;
}

Assistant:

struct lws_context *
lws_create_context(const struct lws_context_creation_info *info)
{
	struct lws_context *context = NULL;
#if defined(LWS_WITH_FILE_OPS)
	struct lws_plat_file_ops *prev;
#endif
#ifndef LWS_NO_DAEMONIZE
	pid_t pid_daemon = get_daemonize_pid();
#endif
#if defined(LWS_WITH_NETWORK)
	int n, count_threads = 1;
	uint8_t *u;
#endif
#if defined(__ANDROID__)
	struct rlimit rt;
#endif
	size_t s1 = 4096, size = sizeof(struct lws_context);
	int lpf = info->fd_limit_per_thread;

	if (lpf) {
		lpf+= 2;
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		lpf++;
#endif
#if defined(LWS_WITH_SYS_NTPCLIENT)
		lpf++;
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
		lpf++;
#endif
	}

	lwsl_info("Initial logging level %d\n", log_level);
	lwsl_info("Libwebsockets version: %s\n", library_version);

#ifdef LWS_WITH_IPV6
	if (!lws_check_opt(info->options, LWS_SERVER_OPTION_DISABLE_IPV6))
		lwsl_info("IPV6 compiled in and enabled\n");
	else
		lwsl_info("IPV6 compiled in but disabled\n");
#else
	lwsl_info("IPV6 not compiled in\n");
#endif

	lwsl_info(" LWS_DEF_HEADER_LEN    : %u\n", LWS_DEF_HEADER_LEN);
	lwsl_info(" LWS_MAX_SMP           : %u\n", LWS_MAX_SMP);
	lwsl_info(" sizeof (*info)        : %ld\n", (long)sizeof(*info));
#if defined(LWS_WITH_STATS)
	lwsl_info(" LWS_WITH_STATS        : on\n");
#endif
	lwsl_info(" SYSTEM_RANDOM_FILEPATH: '%s'\n", SYSTEM_RANDOM_FILEPATH);
#if defined(LWS_WITH_HTTP2)
	lwsl_info(" HTTP2 support         : available\n");
#else
	lwsl_info(" HTTP2 support         : not configured\n");
#endif
	if (lws_plat_context_early_init())
		return NULL;

#if defined(LWS_WITH_NETWORK)
	if (info->count_threads)
		count_threads = info->count_threads;

	if (count_threads > LWS_MAX_SMP)
		count_threads = LWS_MAX_SMP;

	if (info->pt_serv_buf_size)
		s1 = info->pt_serv_buf_size;

	/* pt fakewsi and the pt serv buf allocations ride after the context */
	size += count_threads * (s1 + sizeof(struct lws));
#endif

	context = lws_zalloc(size, "context");
	if (!context) {
		lwsl_err("No memory for websocket context\n");
		return NULL;
	}

	context->uid = info->uid;
	context->gid = info->gid;
	context->username = info->username;
	context->groupname = info->groupname;
	context->system_ops = info->system_ops;
	context->pt_serv_buf_size = (unsigned int)s1;
	context->udp_loss_sim_tx_pc = info->udp_loss_sim_tx_pc;
	context->udp_loss_sim_rx_pc = info->udp_loss_sim_rx_pc;

	if (context->udp_loss_sim_tx_pc || context->udp_loss_sim_rx_pc)
		lwsl_warn("%s: simulating udp loss tx: %d%%, rx: %d%%\n",
			  __func__, context->udp_loss_sim_tx_pc,
			  context->udp_loss_sim_rx_pc);

#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
	context->ss_proxy_bind = info->ss_proxy_bind;
	context->ss_proxy_port = info->ss_proxy_port;
	context->ss_proxy_address = info->ss_proxy_address;
	lwsl_notice("%s: using ss proxy bind '%s', port %d, ads '%s'\n",
			__func__, context->ss_proxy_bind, context->ss_proxy_port,
			context->ss_proxy_address);
#endif

#if defined(LWS_WITH_NETWORK)
	context->count_threads = count_threads;
#if defined(LWS_WITH_DETAILED_LATENCY)
	context->detailed_latency_cb = info->detailed_latency_cb;
	context->detailed_latency_filepath = info->detailed_latency_filepath;
	context->latencies_fd = -1;
#endif
#if defined(LWS_WITHOUT_EXTENSIONS)
        if (info->extensions)
                lwsl_warn("%s: LWS_WITHOUT_EXTENSIONS but extensions ptr set\n", __func__);
#endif
#endif

#if defined(LWS_WITH_SECURE_STREAMS)
	context->pss_policies_json = info->pss_policies_json;
	context->pss_plugins = info->pss_plugins;
#endif

	/* if he gave us names, set the uid / gid */
	if (lws_plat_drop_app_privileges(context, 0))
		goto bail;

	lwsl_info("context created\n");
#if defined(LWS_WITH_TLS) && defined(LWS_WITH_NETWORK)
#if defined(LWS_WITH_MBEDTLS)
	context->tls_ops = &tls_ops_mbedtls;
#else
	context->tls_ops = &tls_ops_openssl;
#endif
#endif

#if LWS_MAX_SMP > 1
	lws_mutex_refcount_init(&context->mr);
#endif

#if defined(LWS_PLAT_FREERTOS)
#if defined(LWS_AMAZON_RTOS)
	context->last_free_heap = xPortGetFreeHeapSize();
#else
	context->last_free_heap = esp_get_free_heap_size();
#endif
#endif

#if defined(LWS_WITH_FILE_OPS)
	/* default to just the platform fops implementation */

	context->fops_platform.LWS_FOP_OPEN	= _lws_plat_file_open;
	context->fops_platform.LWS_FOP_CLOSE	= _lws_plat_file_close;
	context->fops_platform.LWS_FOP_SEEK_CUR	= _lws_plat_file_seek_cur;
	context->fops_platform.LWS_FOP_READ	= _lws_plat_file_read;
	context->fops_platform.LWS_FOP_WRITE	= _lws_plat_file_write;
	context->fops_platform.fi[0].sig	= NULL;

	/*
	 *  arrange a linear linked-list of fops starting from context->fops
	 *
	 * platform fops
	 * [ -> fops_zip (copied into context so .next settable) ]
	 * [ -> info->fops ]
	 */

	context->fops = &context->fops_platform;
	prev = (struct lws_plat_file_ops *)context->fops;

#if defined(LWS_WITH_ZIP_FOPS)
	/* make a soft copy so we can set .next */
	context->fops_zip = fops_zip;
	prev->next = &context->fops_zip;
	prev = (struct lws_plat_file_ops *)prev->next;
#endif

	/* if user provided fops, tack them on the end of the list */
	if (info->fops)
		prev->next = info->fops;
#endif

#if defined(LWS_WITH_SERVER)
	context->reject_service_keywords = info->reject_service_keywords;
#endif
	if (info->external_baggage_free_on_destroy)
		context->external_baggage_free_on_destroy =
			info->external_baggage_free_on_destroy;
#if defined(LWS_WITH_NETWORK)
	context->time_up = lws_now_usecs();
#endif
	context->pcontext_finalize = info->pcontext;

	context->simultaneous_ssl_restriction =
			info->simultaneous_ssl_restriction;

	context->options = info->options;

#ifndef LWS_NO_DAEMONIZE
	if (pid_daemon) {
		context->started_with_parent = pid_daemon;
		lwsl_info(" Started with daemon pid %u\n", (unsigned int)pid_daemon);
	}
#endif
#if defined(__ANDROID__)
	n = getrlimit(RLIMIT_NOFILE, &rt);
	if (n == -1) {
		lwsl_err("Get RLIMIT_NOFILE failed!\n");

		return NULL;
	}
	context->max_fds = rt.rlim_cur;
#else
#if defined(WIN32) || defined(_WIN32) || defined(LWS_AMAZON_RTOS)
	context->max_fds = getdtablesize();
#else
	context->max_fds = sysconf(_SC_OPEN_MAX);
#endif
	if (context->max_fds < 0) {
		lwsl_err("%s: problem getting process max files\n",
			 __func__);

		return NULL;
	}
#endif

	/*
	 * deal with any max_fds override, if it's reducing (setting it to
	 * more than ulimit -n is meaningless).  The platform init will
	 * figure out what if this is something it can deal with.
	 */
	if (info->fd_limit_per_thread) {
		int mf = lpf * context->count_threads;

		if (mf < context->max_fds) {
			context->max_fds_unrelated_to_ulimit = 1;
			context->max_fds = mf;
		}
	}

	context->token_limits = info->token_limits;

#if defined(LWS_WITH_NETWORK)

	/*
	 * set the context event loops ops struct
	 *
	 * after this, all event_loop actions use the generic ops
	 */

#if defined(LWS_WITH_POLL)
	context->event_loop_ops = &event_loop_ops_poll;
#endif

	if (lws_check_opt(context->options, LWS_SERVER_OPTION_LIBUV))
#if defined(LWS_WITH_LIBUV)
		context->event_loop_ops = &event_loop_ops_uv;
#else
		goto fail_event_libs;
#endif

	if (lws_check_opt(context->options, LWS_SERVER_OPTION_LIBEV))
#if defined(LWS_WITH_LIBEV)
		context->event_loop_ops = &event_loop_ops_ev;
#else
		goto fail_event_libs;
#endif

	if (lws_check_opt(context->options, LWS_SERVER_OPTION_LIBEVENT))
#if defined(LWS_WITH_LIBEVENT)
		context->event_loop_ops = &event_loop_ops_event;
#else
		goto fail_event_libs;
#endif

	if (lws_check_opt(context->options, LWS_SERVER_OPTION_GLIB))
#if defined(LWS_WITH_GLIB)
		context->event_loop_ops = &event_loop_ops_glib;
#else
		goto fail_event_libs;
#endif

	if (!context->event_loop_ops)
		goto fail_event_libs;

	lwsl_info("Using event loop: %s\n", context->event_loop_ops->name);
#endif

#if defined(LWS_WITH_TLS) && defined(LWS_WITH_NETWORK)
	time(&context->tls.last_cert_check_s);
	if (info->alpn)
		context->tls.alpn_default = info->alpn;
	else {
		char *p = context->tls.alpn_discovered, first = 1;

		LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
			if (ar->alpn) {
				if (!first)
					*p++ = ',';
				p += lws_snprintf(p,
					context->tls.alpn_discovered +
					sizeof(context->tls.alpn_discovered) -
					2 - p, "%s", ar->alpn);
				first = 0;
			}
		} LWS_FOR_EVERY_AVAILABLE_ROLE_END;

		context->tls.alpn_default = context->tls.alpn_discovered;
	}

	lwsl_info("Default ALPN advertisment: %s\n", context->tls.alpn_default);
#endif

	if (info->timeout_secs)
		context->timeout_secs = info->timeout_secs;
	else
		context->timeout_secs = AWAITING_TIMEOUT;

	context->ws_ping_pong_interval = info->ws_ping_pong_interval;

	lwsl_info(" default timeout (secs): %u\n", context->timeout_secs);

	if (info->max_http_header_data)
		context->max_http_header_data = info->max_http_header_data;
	else
		if (info->max_http_header_data2)
			context->max_http_header_data =
					info->max_http_header_data2;
		else
			context->max_http_header_data = LWS_DEF_HEADER_LEN;

	if (info->max_http_header_pool)
		context->max_http_header_pool = info->max_http_header_pool;
	else
		if (info->max_http_header_pool2)
			context->max_http_header_pool =
					info->max_http_header_pool2;
		else
			context->max_http_header_pool = context->max_fds;

	if (info->fd_limit_per_thread)
		context->fd_limit_per_thread = lpf;
	else
		context->fd_limit_per_thread = context->max_fds /
					       context->count_threads;

#if defined(LWS_WITH_NETWORK)

	context->default_retry.retry_ms_table = default_backoff_table;
	context->default_retry.conceal_count =
			context->default_retry.retry_ms_table_count =
					LWS_ARRAY_SIZE(default_backoff_table);
	context->default_retry.jitter_percent = 20;
	context->default_retry.secs_since_valid_ping = 300;
	context->default_retry.secs_since_valid_hangup = 310;

	if (info->retry_and_idle_policy &&
	    info->retry_and_idle_policy->secs_since_valid_ping) {
		context->default_retry.secs_since_valid_ping =
				info->retry_and_idle_policy->secs_since_valid_ping;
		context->default_retry.secs_since_valid_hangup =
				info->retry_and_idle_policy->secs_since_valid_hangup;
	}

	/*
	 * Allocate the per-thread storage for scratchpad buffers,
	 * and header data pool
	 */
	u = (uint8_t *)&context[1];
	for (n = 0; n < context->count_threads; n++) {
		context->pt[n].serv_buf = u;
		u += context->pt_serv_buf_size;

		context->pt[n].context = context;
		context->pt[n].tid = n;

		/*
		 * We overallocated for a fakewsi (can't compose it in the
		 * pt because size isn't known at that time).  point to it
		 * and zero it down.  Fakewsis are needed to make callbacks work
		 * when the source of the callback is not actually from a wsi
		 * context.
		 */
		context->pt[n].fake_wsi = (struct lws *)u;
		u += sizeof(struct lws);

		memset(context->pt[n].fake_wsi, 0, sizeof(struct lws));

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		context->pt[n].http.ah_list = NULL;
		context->pt[n].http.ah_pool_length = 0;
#endif
		lws_pt_mutex_init(&context->pt[n]);
#if defined(LWS_WITH_SEQUENCER)
		lws_seq_pt_init(&context->pt[n]);
#endif

		LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
			if (ar->pt_init_destroy)
				ar->pt_init_destroy(context, info,
						    &context->pt[n], 0);
		} LWS_FOR_EVERY_AVAILABLE_ROLE_END;

#if defined(LWS_WITH_CGI)
		role_ops_cgi.pt_init_destroy(context, info, &context->pt[n], 0);
#endif
	}

	lwsl_info(" Threads: %d each %d fds\n", context->count_threads,
		    context->fd_limit_per_thread);

	if (!info->ka_interval && info->ka_time > 0) {
		lwsl_err("info->ka_interval can't be 0 if ka_time used\n");
		return NULL;
	}

#if defined(LWS_WITH_PEER_LIMITS)
	/* scale the peer hash table according to the max fds for the process,
	 * so that the max list depth averages 16.  Eg, 1024 fd -> 64,
	 * 102400 fd -> 6400
	 */

	context->pl_hash_elements =
		(context->count_threads * context->fd_limit_per_thread) / 16;
	context->pl_hash_table = lws_zalloc(sizeof(struct lws_peer *) *
			context->pl_hash_elements, "peer limits hash table");

	context->ip_limit_ah = info->ip_limit_ah;
	context->ip_limit_wsi = info->ip_limit_wsi;
#endif

	lwsl_info(" mem: context:         %5lu B (%ld ctx + (%ld thr x %d))\n",
		  (long)sizeof(struct lws_context) +
		  (context->count_threads * context->pt_serv_buf_size),
		  (long)sizeof(struct lws_context),
		  (long)context->count_threads,
		  context->pt_serv_buf_size);
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	lwsl_info(" mem: http hdr size:   (%u + %lu), max count %u\n",
		    context->max_http_header_data,
		    (long)sizeof(struct allocated_headers),
		    context->max_http_header_pool);
#endif

	/*
	 * fds table contains pollfd structs for as many pollfds as we can
	 * handle... spread across as many service threads as we have going
	 */
	n = sizeof(struct lws_pollfd) * context->count_threads *
	    context->fd_limit_per_thread;
	context->pt[0].fds = lws_zalloc(n, "fds table");
	if (context->pt[0].fds == NULL) {
		lwsl_err("OOM allocating %d fds\n", context->max_fds);
		goto bail;
	}
	lwsl_info(" mem: pollfd map:      %5u B\n", n);
#endif
#if defined(LWS_WITH_SERVER)
	if (info->server_string) {
		context->server_string = info->server_string;
		context->server_string_len = (short)
				strlen(context->server_string);
	}
#endif

#if LWS_MAX_SMP > 1
	/* each thread serves his own chunk of fds */
	for (n = 1; n < (int)context->count_threads; n++)
		context->pt[n].fds = context->pt[n - 1].fds +
				     context->fd_limit_per_thread;
#endif

	if (lws_plat_init(context, info))
		goto bail;

#if defined(LWS_WITH_NETWORK)
	if (context->event_loop_ops->init_context)
		if (context->event_loop_ops->init_context(context, info))
			goto bail;


	if (context->event_loop_ops->init_pt)
		for (n = 0; n < context->count_threads; n++) {
			void *lp = NULL;

			if (info->foreign_loops)
				lp = info->foreign_loops[n];

			if (context->event_loop_ops->init_pt(context, lp, n))
				goto bail;
		}

	if (lws_create_event_pipes(context))
		goto bail;
#endif

	lws_context_init_ssl_library(info);

	context->user_space = info->user;

#if defined(LWS_WITH_SERVER)
	strcpy(context->canonical_hostname, "unknown");
#if defined(LWS_WITH_NETWORK)
	lws_server_get_canonical_hostname(context, info);
#endif
#endif

#if defined(LWS_WITH_STATS)
	context->pt[0].sul_stats.cb = lws_sul_stats_cb;
	__lws_sul_insert(&context->pt[0].pt_sul_owner, &context->pt[0].sul_stats,
			 10 * LWS_US_PER_SEC);
#endif
#if defined(LWS_WITH_PEER_LIMITS)
	context->pt[0].sul_peer_limits.cb = lws_sul_peer_limits_cb;
	__lws_sul_insert(&context->pt[0].pt_sul_owner,
			 &context->pt[0].sul_peer_limits, 10 * LWS_US_PER_SEC);
#endif

#if defined(LWS_HAVE_SYS_CAPABILITY_H) && defined(LWS_HAVE_LIBCAP)
	memcpy(context->caps, info->caps, sizeof(context->caps));
	context->count_caps = info->count_caps;
#endif


#if defined(LWS_WITH_NETWORK)

#if defined(LWS_WITH_SYS_ASYNC_DNS) || defined(LWS_WITH_SYS_NTPCLIENT) || \
	defined(LWS_WITH_SYS_DHCP_CLIENT)
	{
		/*
		 * system vhost
		 */

		struct lws_context_creation_info ii;
		const struct lws_protocols *pp[4];
		struct lws_vhost *vh;
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		extern const struct lws_protocols lws_async_dns_protocol;
#endif
#if defined(LWS_WITH_SYS_NTPCLIENT)
		extern const struct lws_protocols lws_system_protocol_ntpc;
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
		extern const struct lws_protocols lws_system_protocol_dhcpc;
#endif

		n = 0;
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		pp[n++] = &lws_async_dns_protocol;
#endif
#if defined(LWS_WITH_SYS_NTPCLIENT)
		pp[n++] = &lws_system_protocol_ntpc;
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
		pp[n++] = &lws_system_protocol_dhcpc;
#endif
		pp[n] = NULL;

		memset(&ii, 0, sizeof(ii));
		ii.vhost_name = "system";
		ii.pprotocols = pp;

		vh = lws_create_vhost(context, &ii);
		if (!vh) {
			lwsl_err("%s: failed to create system vhost\n",
				 __func__);
			goto bail;
		}

		context->vhost_system = vh;

		if (lws_protocol_init_vhost(vh, NULL)) {
			lwsl_err("%s: failed to init system vhost\n", __func__);
			goto bail;
		}
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		if (lws_async_dns_init(context))
			goto bail;
#endif
	}
#endif

	/*
	 * init the lws_state mgr for the system state
	 */
#if defined(_DEBUG)
	context->mgr_system.state_names = system_state_names;
#endif
	context->mgr_system.name = "system";
	context->mgr_system.state = LWS_SYSTATE_CONTEXT_CREATED;
	context->mgr_system.parent = context;

	context->protocols_notify.name = "prot_init";
	context->protocols_notify.notify_cb = lws_state_notify_protocol_init;

	lws_state_reg_notifier(&context->mgr_system, &context->protocols_notify);

	/*
	 * insert user notifiers here so they can participate with vetoing us
	 * trying to jump straight to operational, or at least observe us
	 * reaching 'operational', before we returned from context creation.
	 */

	lws_state_reg_notifier_list(&context->mgr_system,
				    info->register_notifier_list);

	/*
	 * if he's not saying he'll make his own vhosts later then act
	 * compatibly and make a default vhost using the data in the info
	 */
	if (!lws_check_opt(info->options, LWS_SERVER_OPTION_EXPLICIT_VHOSTS))
		if (!lws_create_vhost(context, info)) {
			lwsl_err("Failed to create default vhost\n");

#if defined(LWS_WITH_PEER_LIMITS)
			lws_free_set_NULL(context->pl_hash_table);
#endif
			goto fail_clean_pipes;
		}

#if defined(LWS_WITH_SECURE_STREAMS)

	if (context->pss_policies_json) {
		/*
		 * You must create your context with the explicit vhosts flag
		 * in order to use secure streams
		 */
		assert(lws_check_opt(info->options,
		       LWS_SERVER_OPTION_EXPLICIT_VHOSTS));

		if (lws_ss_policy_parse_begin(context))
			goto bail;

		n = lws_ss_policy_parse(context,
					(uint8_t *)context->pss_policies_json,
					strlen(context->pss_policies_json));
		if (n != LEJP_CONTINUE && n < 0)
			goto bail;

		if (lws_ss_policy_set(context, "hardcoded")) {
			lwsl_err("%s: policy set failed\n", __func__);
			goto bail;
		}
	} else
		lws_create_vhost(context, info);
#endif

	lws_context_init_extensions(info, context);

	lwsl_info(" mem: per-conn:        %5lu bytes + protocol rx buf\n",
		    (unsigned long)sizeof(struct lws));

	/*
	 * drop any root privs for this process
	 * to listen on port < 1023 we would have needed root, but now we are
	 * listening, we don't want the power for anything else
	 */
	if (!lws_check_opt(info->options, LWS_SERVER_OPTION_EXPLICIT_VHOSTS))
		if (lws_plat_drop_app_privileges(context, 1))
			goto bail;

	/*
	 * We want to move on the syste, state as far as it can go towards
	 * OPERATIONAL now.  But we have to return from here first so the user
	 * code that called us can set its copy of context, which it may be
	 * relying on to perform operations triggered by the state change.
	 *
	 * We set up a sul to come back immediately and do the state change.
	 */

	lws_sul_schedule(context, 0, &context->sul_system_state,
			 lws_context_creation_completion_cb, 1);

	/* expedite post-context init (eg, protocols) */
	lws_cancel_service(context);
#endif

	return context;

#if defined(LWS_WITH_NETWORK)
fail_clean_pipes:
	for (n = 0; n < context->count_threads; n++)
		lws_destroy_event_pipe(context->pt[n].pipe_wsi);

	lws_free_set_NULL(context->pt[0].fds);
	lws_plat_context_late_destroy(context);
	lws_free_set_NULL(context);

	return NULL;
#endif

bail:
	lws_context_destroy(context);

	return NULL;

#if defined(LWS_WITH_NETWORK)
fail_event_libs:
	lwsl_err("Requested event library support not configured, available:\n");
	{
		extern const struct lws_event_loop_ops *available_event_libs[];
		const struct lws_event_loop_ops **elops = available_event_libs;

		while (*elops) {
			lwsl_err("  - %s\n", (*elops)->name);
			elops++;
		}
	}
#endif
	lws_free(context);

	return NULL;
}